

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::checkseg4split(tetgenmesh *this,face *chkseg,point *encpt,int *qflag)

{
  shellface ppdVar1;
  shellface ppdVar2;
  tetgenbehavior *ptVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double ccent [3];
  double local_78;
  double local_48 [3];
  
  ppdVar1 = chkseg->sh[sorgpivot[chkseg->shver]];
  ppdVar2 = chkseg->sh[sdestpivot[chkseg->shver]];
  *encpt = (point)0x0;
  *qflag = 0;
  dVar10 = ((double)ppdVar2[2] - (double)ppdVar1[2]) * ((double)ppdVar2[2] - (double)ppdVar1[2]) +
           ((double)*ppdVar2 - (double)*ppdVar1) * ((double)*ppdVar2 - (double)*ppdVar1) +
           ((double)ppdVar2[1] - (double)ppdVar1[1]) * ((double)ppdVar2[1] - (double)ppdVar1[1]);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  lVar7 = 0;
  do {
    local_48[lVar7] = ((double)ppdVar1[lVar7] + (double)ppdVar2[lVar7]) * 0.5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if ((((this->checkconstraints != 0) && (0.0 < (double)chkseg->sh[this->areaboundindex])) &&
      ((double)chkseg->sh[this->areaboundindex] < dVar10)) ||
     ((ptVar3 = this->b, ptVar3->fixedvolume != 0 &&
      (dVar11 = dVar10 * dVar10 * dVar10, ptVar3->maxvolume <= dVar11 && dVar11 != ptVar3->maxvolume
      )))) {
LAB_001440ca:
    *qflag = 1;
    uVar6 = 1;
  }
  else {
    dVar10 = dVar10 * 0.5;
    if (ptVar3->metric != 0) {
      if (((0.0 < (double)ppdVar1[this->pointmtrindex]) &&
          ((double)ppdVar1[this->pointmtrindex] < dVar10)) ||
         ((0.0 < (double)ppdVar2[this->pointmtrindex] &&
          ((double)ppdVar2[this->pointmtrindex] < dVar10)))) goto LAB_001440ca;
    }
    uVar6 = (uint)chkseg->sh[9] & 0xf;
    uVar8 = (ulong)chkseg->sh[9] & 0xfffffffffffffff0;
    local_78 = 0.0;
    uVar9 = uVar8;
    do {
      pdVar4 = *(double **)(uVar9 + (long)apexpivot[(int)uVar6] * 8);
      if (pdVar4 != this->dummypoint) {
        dVar11 = (pdVar4[2] - local_48[2]) * (pdVar4[2] - local_48[2]) +
                 (*pdVar4 - local_48[0]) * (*pdVar4 - local_48[0]) +
                 (pdVar4[1] - local_48[1]) * (pdVar4[1] - local_48[1]);
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        if ((dVar11 - dVar10 < 0.0) && (this->b->epsilon <= ABS(dVar11 - dVar10) / dVar10)) {
          if (this->useinsertradius == 0) {
            *encpt = pdVar4;
            break;
          }
          if ((*encpt == (point)0x0) || (dVar11 < local_78)) {
            *encpt = pdVar4;
            local_78 = dVar11;
          }
        }
      }
      uVar5 = *(ulong *)(uVar9 + (long)facepivot1[(int)uVar6] * 8);
      uVar9 = uVar5 & 0xfffffffffffffff0;
      uVar6 = facepivot2[(int)uVar6][(uint)uVar5 & 0xf];
    } while (uVar9 != uVar8);
    uVar6 = (uint)(*encpt != (point)0x0);
  }
  return uVar6;
}

Assistant:

int tetgenmesh::checkseg4split(face *chkseg, point& encpt, int& qflag)
{
  REAL ccent[3], len, r;
  int i;

  point forg = sorg(*chkseg);
  point fdest = sdest(*chkseg);

  // Initialize the return values.
  encpt = NULL;
  qflag = 0;

  len = distance(forg, fdest);
  r = 0.5 * len;
  for (i = 0; i < 3; i++) {
    ccent[i] = 0.5 * (forg[i] + fdest[i]);
  }

  // First check its quality.
  if (checkconstraints && (areabound(*chkseg) > 0.0)) {
    if (len > areabound(*chkseg)) {
      qflag = 1;
      return 1;
    }
  }

  if (b->fixedvolume) {
    if ((len * len * len) > b->maxvolume) {
      qflag = 1;
      return 1;
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Check if the ccent lies outside one of the prot.balls at vertices.
    if (((forg[pointmtrindex] > 0) && (r > forg[pointmtrindex])) ||
        ((fdest[pointmtrindex]) > 0 && (r > fdest[pointmtrindex]))) {
      qflag = 1; // Enforce mesh size.
      return 1;
    }
  }


  // Second check if it is encroached.
  // Comment: There may exist more than one encroaching points of this segment. 
  //   The 'encpt' returns the one which is closet to it.
  triface searchtet, spintet;
  point eapex;
  REAL d, diff, smdist = 0;
  int t1ver;

  sstpivot1(*chkseg, searchtet);
  spintet = searchtet;
  while (1) {
    eapex = apex(spintet);
    if (eapex != dummypoint) {
      d = distance(ccent, eapex);
      diff = d - r;
      if (fabs(diff) / r < b->epsilon) diff = 0.0; // Rounding.
      if (diff < 0) {
        // This segment is encroached by eapex.
        if (useinsertradius) {
          if (encpt == NULL) {
            encpt = eapex;
            smdist = d;
          } else {
            // Choose the closet encroaching point.
            if (d < smdist) {
              encpt = eapex;
              smdist = d;
            }
          }
        } else {
          encpt = eapex;
          break;
        }
      }
    }
    fnextself(spintet);
    if (spintet.tet == searchtet.tet) break;
  } // while (1)

  if (encpt != NULL) {
    return 1;
  }

  return 0; // No need to split it.
}